

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ma.c
# Opt level: O0

ErrorNumber do_test_ma(TA_History *history,TA_Test_conflict6 *test,int testMAVP)

{
  int iVar1;
  int iVar2;
  double *inReal;
  RangeTestFunction testFunction;
  int in_EDX;
  int *in_RSI;
  double *in_RDI;
  TA_Real *referenceInput;
  TA_Integer temp2;
  TA_Integer temp;
  TA_RangeTestParam_conflict6 testParam;
  TA_Integer outNbElement;
  TA_Integer outBegIdx;
  ErrorNumber errNb;
  TA_RetCode retCode;
  double *in_stack_000001c8;
  int *in_stack_000001d0;
  int *in_stack_000001d8;
  double in_stack_000001e0;
  double in_stack_000001e8;
  double *in_stack_000001f0;
  int in_stack_000001fc;
  int in_stack_00000200;
  double *in_stack_00000210;
  undefined8 in_stack_ffffffffffffff58;
  TA_Real *pTVar3;
  TA_Real *pTVar4;
  TA_Real TVar5;
  undefined4 uVar6;
  TA_MAType optInMAType;
  TA_Real *in_stack_ffffffffffffff60;
  uint uVar8;
  undefined8 uVar7;
  uint uVar9;
  TA_Real *in_stack_ffffffffffffff68;
  TA_Real *in_stack_ffffffffffffff70;
  TA_FuncUnstId unstId;
  TA_Real *in_stack_ffffffffffffff78;
  int *in_stack_ffffffffffffff80;
  TA_MAType in_stack_ffffffffffffff88;
  uint oneOfTheExpectedOutRealIndex;
  int in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  double *in_stack_ffffffffffffffa8;
  double *in_stack_ffffffffffffffb0;
  double *in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffc0;
  int local_34;
  TA_MAType in_stack_ffffffffffffffd0;
  ErrorNumber local_2c;
  TA_RetCode TVar10;
  ErrorNumber local_c;
  
  uVar8 = (uint)((ulong)in_stack_ffffffffffffff58 >> 0x20);
  if ((in_EDX == 0) || (in_RSI[1] == 0)) {
    TA_SetCompatibility(in_RSI[7]);
    clearAllBuffers();
    setInputBuffer(0,(TA_Real *)in_RDI[4],*(uint *)in_RDI);
    setInputBuffer(1,(TA_Real *)in_RDI[4],*(uint *)in_RDI);
    if (in_EDX != 0) {
      setInputBufferValue(2,(double)in_RSI[5],*(uint *)in_RDI);
    }
    TA_SetUnstablePeriod(TA_FUNC_UNST_ALL,0);
    inReal = (double *)(ulong)(in_RSI[6] - 1);
    switch(inReal) {
    case (double *)0x0:
    case (double *)0x2:
    case (double *)0x3:
      TVar10 = TA_SetUnstablePeriod(TA_FUNC_UNST_EMA,in_RSI[2]);
      break;
    default:
      TVar10 = TA_SUCCESS;
      break;
    case (double *)0x5:
      TVar10 = TA_SetUnstablePeriod(TA_FUNC_UNST_KAMA,in_RSI[2]);
      break;
    case (double *)0x6:
      TVar10 = TA_SetUnstablePeriod(TA_FUNC_UNST_MAMA,in_RSI[2]);
      break;
    case (double *)0x7:
      TVar10 = TA_SetUnstablePeriod(TA_FUNC_UNST_T3,in_RSI[2]);
    }
    if (TVar10 == TA_SUCCESS) {
      if (in_RSI[6] == 7) {
        TA_MEDPRICE(0,*(uint *)in_RDI - 1,(double *)in_RDI[2],(double *)in_RDI[3],
                    (int *)&stack0xffffffffffffffd0,&local_34,gBuffer[0].in);
        TA_MEDPRICE(0,*(uint *)in_RDI - 1,(double *)in_RDI[2],(double *)in_RDI[3],
                    (int *)&stack0xffffffffffffffd0,&local_34,gBuffer[1].in);
        pTVar3 = gBuffer[2].in;
        TA_MEDPRICE(0,*(uint *)in_RDI - 1,(double *)in_RDI[2],(double *)in_RDI[3],
                    (int *)&stack0xffffffffffffffd0,&local_34,gBuffer[2].in);
        uVar8 = (uint)((ulong)pTVar3 >> 0x20);
        pTVar3 = gBuffer[2].in;
      }
      else {
        pTVar3 = (TA_Real *)in_RDI[4];
      }
      iVar1 = in_RSI[1];
      if (iVar1 == 0) {
        if (in_EDX == 0) {
          uVar8 = (uint)((ulong)&local_34 >> 0x20);
          in_stack_ffffffffffffff60 = gBuffer[0].out0;
          TVar10 = TA_MA(in_stack_ffffffffffffffa0,(int)((ulong)pTVar3 >> 0x20),inReal,0,
                         in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                         (int *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffb8);
        }
        else {
          in_stack_ffffffffffffff60 = (TA_Real *)&stack0xffffffffffffffd0;
          in_stack_ffffffffffffff68 = (TA_Real *)&local_34;
          in_stack_ffffffffffffff70 = gBuffer[0].out0;
          TVar10 = TA_MAVP(in_stack_ffffffffffffffc0,(int)((ulong)in_stack_ffffffffffffffb8 >> 0x20)
                           ,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                           in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0,
                           in_stack_ffffffffffffffd0,(int *)CONCAT44(in_EDX,TVar10),in_RSI,in_RDI);
        }
      }
      else if (iVar1 == 1) {
        pTVar4 = gBuffer[0].out2;
        TVar10 = TA_MAMA(in_stack_00000200,in_stack_000001fc,in_stack_000001f0,in_stack_000001e8,
                         in_stack_000001e0,in_stack_000001d8,in_stack_000001d0,in_stack_000001c8,
                         in_stack_00000210);
        uVar8 = (uint)((ulong)pTVar4 >> 0x20);
      }
      else if (iVar1 == 2) {
        pTVar4 = gBuffer[0].out0;
        TVar10 = TA_MAMA(in_stack_00000200,in_stack_000001fc,in_stack_000001f0,in_stack_000001e8,
                         in_stack_000001e0,in_stack_000001d8,in_stack_000001d0,in_stack_000001c8,
                         in_stack_00000210);
        uVar8 = (uint)((ulong)pTVar4 >> 0x20);
      }
      local_c = checkDataSame(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,uVar8);
      if (local_c == TA_TEST_PASS) {
        TVar5 = (TA_Real)CONCAT44(uVar8,in_RSI[0xd]);
        uVar8 = (uint)((ulong)in_stack_ffffffffffffff60 >> 0x20);
        local_c = checkExpectedValue(in_stack_ffffffffffffff78,
                                     (TA_RetCode)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                                     (TA_RetCode)in_stack_ffffffffffffff70,
                                     (uint)((ulong)in_stack_ffffffffffffff68 >> 0x20),
                                     (uint)in_stack_ffffffffffffff68,uVar8,(uint)inReal,TVar5,
                                     (uint)pTVar3);
        uVar6 = (undefined4)((ulong)TVar5 >> 0x20);
        if (local_c == TA_TEST_PASS) {
          local_34 = 0;
          iVar2 = in_RSI[1];
          if (iVar2 == 0) {
            if (in_EDX == 0) {
              uVar6 = (undefined4)((ulong)&local_34 >> 0x20);
              pTVar4 = gBuffer[1].in;
              TA_MA(in_stack_ffffffffffffffa0,(int)((ulong)pTVar3 >> 0x20),inReal,iVar1,
                    TA_MAType_SMA,in_stack_ffffffffffffff80,(int *)in_stack_ffffffffffffffb0,
                    in_stack_ffffffffffffffb8);
              uVar8 = (uint)((ulong)pTVar4 >> 0x20);
            }
            else {
              uVar8 = (uint)((ulong)&stack0xffffffffffffffd0 >> 0x20);
              in_stack_ffffffffffffff68 = (TA_Real *)&local_34;
              in_stack_ffffffffffffff70 = gBuffer[1].in;
              TA_MAVP(in_stack_ffffffffffffffc0,(int)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
                      in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,
                      in_stack_ffffffffffffffa0,TA_MAType_SMA,(int *)CONCAT44(in_EDX,TVar10),in_RSI,
                      in_RDI);
            }
          }
          else if (iVar2 == 1) {
            pTVar4 = gBuffer[0].out2;
            TA_MAMA(in_stack_00000200,in_stack_000001fc,in_stack_000001f0,in_stack_000001e8,
                    in_stack_000001e0,in_stack_000001d8,in_stack_000001d0,in_stack_000001c8,
                    in_stack_00000210);
            uVar6 = (undefined4)((ulong)pTVar4 >> 0x20);
          }
          else if (iVar2 == 2) {
            pTVar4 = gBuffer[1].in;
            TA_MAMA(in_stack_00000200,in_stack_000001fc,in_stack_000001f0,in_stack_000001e8,
                    in_stack_000001e0,in_stack_000001d8,in_stack_000001d0,in_stack_000001c8,
                    in_stack_00000210);
            uVar6 = (undefined4)((ulong)pTVar4 >> 0x20);
          }
          oneOfTheExpectedOutRealIndex = (uint)pTVar3;
          uVar9 = (uint)inReal;
          local_c = checkSameContent(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
          if (local_c == TA_TEST_PASS) {
            TVar5 = (TA_Real)CONCAT44(uVar6,in_RSI[0xd]);
            uVar7 = CONCAT44(uVar8,in_RSI[9]);
            local_c = checkExpectedValue(in_stack_ffffffffffffff78,
                                         (TA_RetCode)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                                         (TA_RetCode)in_stack_ffffffffffffff70,
                                         (uint)((ulong)in_stack_ffffffffffffff68 >> 0x20),
                                         (uint)in_stack_ffffffffffffff68,uVar8,uVar9,TVar5,
                                         oneOfTheExpectedOutRealIndex);
            optInMAType = (TA_MAType)((ulong)TVar5 >> 0x20);
            unstId = (TA_FuncUnstId)((ulong)in_stack_ffffffffffffff70 >> 0x20);
            if (local_c == TA_TEST_PASS) {
              if (1 < in_RSI[5]) {
                switch(in_RSI[6]) {
                case 0:
                  iVar1 = TA_SMA_Lookback(in_RSI[5]);
                  break;
                case 1:
                  iVar1 = TA_EMA_Lookback(in_RSI[5]);
                  break;
                case 2:
                  iVar1 = TA_WMA_Lookback(in_RSI[5]);
                  break;
                case 3:
                  iVar1 = TA_DEMA_Lookback(0x119447);
                  break;
                case 4:
                  iVar1 = TA_TEMA_Lookback((int)uVar7);
                  break;
                case 5:
                  iVar1 = TA_TRIMA_Lookback(in_RSI[5]);
                  break;
                case 6:
                  iVar1 = TA_KAMA_Lookback(in_RSI[5]);
                  break;
                case 7:
                  iVar1 = TA_MAMA_Lookback(0.5,0.05);
                  break;
                case 8:
                  iVar1 = TA_T3_Lookback(in_RSI[5],0.7);
                  break;
                default:
                  return TA_TEST_TFRR_BAD_MA_TYPE;
                }
                iVar2 = TA_MA_Lookback((int)uVar7,optInMAType);
                if (iVar1 != iVar2) {
                  printf("\nFailed for MA Type #%d for period %d\n",(ulong)(uint)in_RSI[6],
                         (ulong)(uint)in_RSI[5]);
                  return TA_TEST_TFFR_BAD_MA_LOOKBACK;
                }
              }
              if (*in_RSI != 0) {
                testFunction = (RangeTestFunction)(ulong)(in_RSI[6] - 1);
                uVar8 = (uint)uVar7;
                uVar9 = (uint)((ulong)uVar7 >> 0x20);
                switch(testFunction) {
                case (RangeTestFunction)0x0:
                case (RangeTestFunction)0x2:
                case (RangeTestFunction)0x3:
                  local_2c = doRangeTest(testFunction,unstId,in_stack_ffffffffffffff68,uVar9,uVar8);
                  break;
                default:
                  local_2c = doRangeTest(testFunction,unstId,in_stack_ffffffffffffff68,uVar9,uVar8);
                  break;
                case (RangeTestFunction)0x5:
                  local_2c = doRangeTest(testFunction,unstId,in_stack_ffffffffffffff68,uVar9,uVar8);
                  break;
                case (RangeTestFunction)0x6:
                  local_2c = doRangeTest(testFunction,unstId,in_stack_ffffffffffffff68,uVar9,uVar8);
                  break;
                case (RangeTestFunction)0x7:
                  local_2c = doRangeTest(testFunction,unstId,in_stack_ffffffffffffff68,uVar9,uVar8);
                }
                if (local_2c != TA_TEST_PASS) {
                  return local_2c;
                }
              }
              local_c = TA_TEST_PASS;
            }
          }
        }
      }
    }
    else {
      local_c = TA_TEST_TFRR_SETUNSTABLE_PERIOD_FAIL;
    }
  }
  else {
    local_c = TA_TEST_PASS;
  }
  return local_c;
}

Assistant:

static ErrorNumber do_test_ma( const TA_History *history,
                               const TA_Test *test,
							   int testMAVP )
{
   TA_RetCode retCode;
   ErrorNumber errNb;
   TA_Integer outBegIdx;
   TA_Integer outNbElement;
   TA_RangeTestParam testParam;
   TA_Integer temp, temp2;
   const TA_Real *referenceInput;

   /* TA_MAVP is tested only for TA_ANY_MA_TEST */
   if( testMAVP && (test->id != TA_ANY_MA_TEST) )
   {
      return TA_TEST_PASS;
   }

   TA_SetCompatibility( (TA_Compatibility)test->compatibility );

   /* Set to NAN all the elements of the gBuffers.  */
   clearAllBuffers();

   /* Build the input. */
   setInputBuffer( 0, history->close, history->nbBars );
   setInputBuffer( 1, history->close, history->nbBars );
   if( testMAVP )
   {
      setInputBufferValue( 2, test->optInTimePeriod, history->nbBars );
   }

   /* Re-initialize all the unstable period to zero. */
   TA_SetUnstablePeriod( TA_FUNC_UNST_ALL, 0 );

   /* Set the unstable period requested for that test. */
   switch( test->optInMAType_1 )
   {
   case TA_MAType_TEMA:
   case TA_MAType_DEMA:
   case TA_MAType_EMA:
      retCode = TA_SetUnstablePeriod( TA_FUNC_UNST_EMA, test->unstablePeriod );
      break;
   case TA_MAType_KAMA:
      retCode = TA_SetUnstablePeriod( TA_FUNC_UNST_KAMA, test->unstablePeriod );
      break;
   case TA_MAType_MAMA:
      retCode = TA_SetUnstablePeriod( TA_FUNC_UNST_MAMA, test->unstablePeriod );
      break;
   case TA_MAType_T3:
      retCode = TA_SetUnstablePeriod( TA_FUNC_UNST_T3, test->unstablePeriod );
      break;
   default:
      retCode = TA_SUCCESS;
      break;
   }

   if( retCode != TA_SUCCESS )
      return TA_TEST_TFRR_SETUNSTABLE_PERIOD_FAIL;

   /* Transform the inputs for MAMA (it is an AVGPRICE in John Ehlers book). */
   if( test->optInMAType_1 == TA_MAType_MAMA )
   {
      TA_MEDPRICE( 0, history->nbBars-1, history->high, history->low,
                   &outBegIdx, &outNbElement, gBuffer[0].in );

      TA_MEDPRICE( 0, history->nbBars-1, history->high, history->low,
                   &outBegIdx, &outNbElement, gBuffer[1].in );

      /* Will be use as reference */
      TA_MEDPRICE( 0, history->nbBars-1, history->high, history->low,
                   &outBegIdx, &outNbElement, gBuffer[2].in );
      referenceInput = gBuffer[2].in;
   }
   else
      referenceInput = history->close;



   /* Make a simple first call. */
   switch( test->id )
   {
   case TA_ANY_MA_TEST:
	  if(testMAVP)
	  {
         retCode = TA_MAVP( test->startIdx,
                            test->endIdx,
                            gBuffer[0].in,
							gBuffer[2].in,
							2, test->optInTimePeriod,
                            (TA_MAType)test->optInMAType_1,
                            &outBegIdx,
                            &outNbElement,
                            gBuffer[0].out0 );
	  }
	  else
	  {
         retCode = TA_MA( test->startIdx,
                          test->endIdx,
                          gBuffer[0].in,
                          test->optInTimePeriod,
                          (TA_MAType)test->optInMAType_1,
                          &outBegIdx,
                          &outNbElement,
                          gBuffer[0].out0 );
	  }
      break;
   case TA_MAMA_TEST:
      retCode = TA_MAMA( test->startIdx,
                         test->endIdx,
                         gBuffer[0].in,
                         0.5, 0.05,
                         &outBegIdx,
                         &outNbElement,
                         gBuffer[0].out0,
                         gBuffer[0].out2 );

     break;
   case TA_FAMA_TEST:
      retCode = TA_MAMA( test->startIdx,
                         test->endIdx,
                         gBuffer[0].in,
                         0.5, 0.05,
                         &outBegIdx,
                         &outNbElement,
                         gBuffer[0].out2,
                         gBuffer[0].out0 );

     break;
   }

   errNb = checkDataSame( gBuffer[0].in, referenceInput, history->nbBars );
   if( errNb != TA_TEST_PASS )
      return errNb;

   errNb = checkExpectedValue( gBuffer[0].out0,
                               retCode, test->expectedRetCode,
                               outBegIdx, test->expectedBegIdx,
                               outNbElement, test->expectedNbElement,
                               test->oneOfTheExpectedOutReal,
                               test->oneOfTheExpectedOutRealIndex );
   if( errNb != TA_TEST_PASS )
      return errNb;

   outBegIdx = outNbElement = 0;

   /* Make another call where the input and the output are the
    * same buffer.
    */
   switch( test->id )
   {
   case TA_ANY_MA_TEST:
	  if(testMAVP)
   	  {
      retCode = TA_MAVP( test->startIdx,
                       test->endIdx,
                       gBuffer[1].in,
					   gBuffer[2].in,
                       2,test->optInTimePeriod,
                       (TA_MAType)test->optInMAType_1,
                       &outBegIdx,
                       &outNbElement,
                       gBuffer[1].in );
	  }
	  else
	  {
      retCode = TA_MA( test->startIdx,
                       test->endIdx,
                       gBuffer[1].in,
                       test->optInTimePeriod,
                       (TA_MAType)test->optInMAType_1,
                       &outBegIdx,
                       &outNbElement,
                       gBuffer[1].in );
	  }
      break;
   case TA_MAMA_TEST:
      retCode = TA_MAMA( test->startIdx,
                         test->endIdx,
                         gBuffer[1].in,
                         0.5, 0.05,
                         &outBegIdx,
                         &outNbElement,
                         gBuffer[1].in,
                         gBuffer[0].out2 );
     break;
   case TA_FAMA_TEST:
      retCode = TA_MAMA( test->startIdx,
                         test->endIdx,
                         gBuffer[1].in,
                         0.5, 0.05,
                         &outBegIdx,
                         &outNbElement,
                         gBuffer[0].out2,
                         gBuffer[1].in );
     break;
   }

   /* The previous call to TA_MA should have the same output
    * as this call.
    *
    * checkSameContent verify that all value different than NAN in
    * the first parameter is identical in the second parameter.
    */
   errNb = checkSameContent( gBuffer[0].out0, gBuffer[1].in );
   if( errNb != TA_TEST_PASS )
      return errNb;

   errNb = checkExpectedValue( gBuffer[1].in,
                               retCode, test->expectedRetCode,
                               outBegIdx, test->expectedBegIdx,
                               outNbElement, test->expectedNbElement,
                               test->oneOfTheExpectedOutReal,
                               test->oneOfTheExpectedOutRealIndex );
   if( errNb != TA_TEST_PASS )
      return errNb;

  /* Verify that the "all-purpose" TA_MA_Lookback is consistent
   * with the corresponding moving average lookback function.
   */
   if( test->optInTimePeriod >= 2 )
   {
      switch( test->optInMAType_1 )
      {
      case TA_MAType_WMA:
         temp = TA_WMA_Lookback( test->optInTimePeriod );
         break;

      case TA_MAType_SMA:
         temp = TA_SMA_Lookback( test->optInTimePeriod );
         break;

      case TA_MAType_EMA:
         temp = TA_EMA_Lookback( test->optInTimePeriod );
         break;

      case TA_MAType_DEMA:
         temp = TA_DEMA_Lookback( test->optInTimePeriod );
         break;

      case TA_MAType_TEMA:
         temp = TA_TEMA_Lookback( test->optInTimePeriod );
         break;

      case TA_MAType_KAMA:
         temp = TA_KAMA_Lookback( test->optInTimePeriod );
         break;

      case TA_MAType_MAMA:
         temp = TA_MAMA_Lookback( 0.5, 0.05 );
         break;

      case TA_MAType_TRIMA:
         temp = TA_TRIMA_Lookback( test->optInTimePeriod );
         break;

      case TA_MAType_T3:
         temp = TA_T3_Lookback( test->optInTimePeriod, 0.7 );
         break;

      default:
         return TA_TEST_TFRR_BAD_MA_TYPE;
      }

      temp2 = TA_MA_Lookback( test->optInTimePeriod, (TA_MAType)test->optInMAType_1 );

      if( temp != temp2 )
      {
         printf( "\nFailed for MA Type #%d for period %d\n", test->optInMAType_1, test->optInTimePeriod );
         return TA_TEST_TFFR_BAD_MA_LOOKBACK;
      }
   }

   /* Do a systematic test of most of the
    * possible startIdx/endIdx range.
    */
   testParam.test  = test;
   testParam.close = referenceInput;
   testParam.testMAVP = testMAVP;
   testParam.mavpPeriod = gBuffer[2].in;

   if( test->doRangeTestFlag )
   {
      switch( test->optInMAType_1 )
      {
      case TA_MAType_TEMA:
      case TA_MAType_DEMA:
      case TA_MAType_EMA:
         errNb = doRangeTest( rangeTestFunction,
                              TA_FUNC_UNST_EMA,
                              (void *)&testParam, 1, 0 );
         break;
      case TA_MAType_T3:
         errNb = doRangeTest( rangeTestFunction,
                              TA_FUNC_UNST_T3,
                              (void *)&testParam, 1, 0 );
         break;
      case TA_MAType_KAMA:
         errNb = doRangeTest( rangeTestFunction,
                              TA_FUNC_UNST_KAMA,
                              (void *)&testParam, 1, 0 );
         break;
      case TA_MAType_MAMA:
         errNb = doRangeTest( rangeTestFunction,
                              TA_FUNC_UNST_MAMA,
                              (void *)&testParam, 2, 0 );
         break;
      default:
         errNb = doRangeTest( rangeTestFunction,
                              TA_FUNC_UNST_NONE,
                              (void *)&testParam, 1, 0 );
      }

      if( errNb != TA_TEST_PASS )
         return errNb;
   }

   return TA_TEST_PASS;
}